

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint aom_sad128x128_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  uint uVar1;
  uint uVar2;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_R8;
  uint32_t sum;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = aom_sad128x64_avg_avx2
                    ((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)in_RDX >> 0x20),
                     (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_R8 >> 0x20),
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar2 = aom_sad128x64_avg_avx2
                    ((uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)(in_RDX + (in_ECX << 6)) >> 0x20),
                     (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)(in_R8 + 0x2000) >> 0x20),
                     (uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_sad128x128_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *ref_ptr, int ref_stride,
                                     const uint8_t *second_pred) {
  uint32_t sum = aom_sad128x64_avg_avx2(src_ptr, src_stride, ref_ptr,
                                        ref_stride, second_pred);
  src_ptr += src_stride << 6;
  ref_ptr += ref_stride << 6;
  second_pred += 128 << 6;
  sum += aom_sad128x64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride,
                                second_pred);
  return sum;
}